

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::ReorderingBuffer::resize(ReorderingBuffer *this,int32_t appendLength,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UChar *pUVar2;
  UnicodeString *this_00;
  UBool UVar3;
  int iVar4;
  char16_t *pcVar5;
  int32_t minCapacity;
  int newLength;
  
  pUVar1 = this->reorderStart;
  pUVar2 = this->start;
  newLength = (int)((ulong)((long)this->limit - (long)pUVar2) >> 1);
  UnicodeString::releaseBuffer(this->str,newLength);
  this_00 = this->str;
  iVar4 = 0x36;
  if (((this_00->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
    iVar4 = (this_00->fUnion).fFields.fCapacity * 2;
  }
  if (iVar4 < appendLength + newLength) {
    iVar4 = appendLength + newLength;
  }
  minCapacity = 0x100;
  if (0x100 < iVar4) {
    minCapacity = iVar4;
  }
  pcVar5 = UnicodeString::getBuffer(this_00,minCapacity);
  this->start = pcVar5;
  if (pcVar5 == (char16_t *)0x0) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    UVar3 = '\0';
  }
  else {
    this->reorderStart = pcVar5 + (int)((ulong)((long)pUVar1 - (long)pUVar2) >> 1);
    this->limit = pcVar5 + newLength;
    if (((this->str->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      iVar4 = (this->str->fUnion).fFields.fCapacity;
    }
    else {
      iVar4 = 0x1b;
    }
    this->remainingCapacity = iVar4 - newLength;
    UVar3 = '\x01';
  }
  return UVar3;
}

Assistant:

UBool ReorderingBuffer::resize(int32_t appendLength, UErrorCode &errorCode) {
    int32_t reorderStartIndex=(int32_t)(reorderStart-start);
    int32_t length=(int32_t)(limit-start);
    str.releaseBuffer(length);
    int32_t newCapacity=length+appendLength;
    int32_t doubleCapacity=2*str.getCapacity();
    if(newCapacity<doubleCapacity) {
        newCapacity=doubleCapacity;
    }
    if(newCapacity<256) {
        newCapacity=256;
    }
    start=str.getBuffer(newCapacity);
    if(start==NULL) {
        // getBuffer() already did str.setToBogus()
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    reorderStart=start+reorderStartIndex;
    limit=start+length;
    remainingCapacity=str.getCapacity()-length;
    return TRUE;
}